

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O1

void __thiscall EmmyFacade::Attach(EmmyFacade *this,lua_State *L)

{
  bool bVar1;
  
  bVar1 = Transporter::IsConnected
                    ((this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if (bVar1) {
    if (this->isAPIReady == false) {
      bVar1 = install_emmy_debugger(L);
      this->isAPIReady = bVar1;
    }
    (*lua_sethook)(L,HookLua,7,0);
    return;
  }
  return;
}

Assistant:

void EmmyFacade::Attach(lua_State *L) {
	if (!this->transporter->IsConnected())
		return;

	// 这里存在一个问题就是 hook 的时机太早了，globalstate 都还没初始化完毕

	if (!isAPIReady) {
		// 考虑到emmy_hook use lua source
		isAPIReady = install_emmy_debugger(L);
	}

	lua_sethook(L, EmmyFacade::HookLua, LUA_MASKCALL | LUA_MASKLINE | LUA_MASKRET, 0);
}